

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O0

uint RigidBodyDynamics::GetMovableBodyId(Model *model,uint id)

{
  bool bVar1;
  reference pvVar2;
  uint in_ESI;
  long in_RDI;
  uint fbody_id;
  uint local_4;
  
  bVar1 = Model::IsFixedBodyId(model,id);
  local_4 = in_ESI;
  if (bVar1) {
    pvVar2 = std::
             vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             ::operator[]((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                           *)(in_RDI + 0x318),(ulong)(in_ESI - *(int *)(in_RDI + 0x330)));
    local_4 = pvVar2->mMovableParent;
  }
  return local_4;
}

Assistant:

unsigned int GetMovableBodyId (Model& model, unsigned int id)
{
  if(model.IsFixedBodyId(id)) {
    unsigned int fbody_id = id - model.fixed_body_discriminator;
    return model.mFixedBodies[fbody_id].mMovableParent;
  } else {
    return id;
  }
}